

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

int32 __thiscall
Js::JavascriptArray::GetNativeValue<int>
          (JavascriptArray *this,Var ival,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  
  if (((ulong)ival & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)ival & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)ival & 0xffff000000000000) != 0x1000000000000) {
      iVar3 = JavascriptConversion::ToInt32_Full(ival,scriptContext);
      return iVar3;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b6f6d8;
    *puVar4 = 0;
  }
  if (((ulong)ival & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00b6f6d8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (int32)ival;
}

Assistant:

int32 JavascriptArray::GetNativeValue<int32>(Js::Var ival, ScriptContext * scriptContext)
    {
        return JavascriptConversion::ToInt32(ival, scriptContext);
    }